

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O2

void __thiscall icu_63::FCDUIterCollationIterator::switchToBackward(FCDUIterCollationIterator *this)

{
  State SVar1;
  UCharIterator *pUVar2;
  int32_t iVar3;
  State SVar4;
  
  SVar1 = this->state;
  SVar4 = ITER_CHECK_BWD;
  if (SVar1 == IN_NORM_ITER_AT_LIMIT) {
    pUVar2 = (this->super_UIterCollationIterator).iter;
    (*pUVar2->move)(pUVar2,this->start - this->limit,UITER_CURRENT);
  }
  else {
    if (SVar1 == ITER_IN_FCD_SEGMENT) goto LAB_0022085b;
    if (SVar1 == ITER_CHECK_FWD) {
      pUVar2 = (this->super_UIterCollationIterator).iter;
      iVar3 = (*pUVar2->getIndex)(pUVar2,UITER_CURRENT);
      this->pos = iVar3;
      this->limit = iVar3;
      SVar4 = (iVar3 != this->start) + ITER_CHECK_BWD;
      goto LAB_0022085b;
    }
  }
  this->limit = this->start;
LAB_0022085b:
  this->state = SVar4;
  return;
}

Assistant:

void
FCDUIterCollationIterator::switchToBackward() {
    U_ASSERT(state == ITER_CHECK_FWD ||
             (state == ITER_IN_FCD_SEGMENT && pos == start) ||
             (state >= IN_NORM_ITER_AT_LIMIT && pos == 0));
    if(state == ITER_CHECK_FWD) {
        // Turn around from forward checking.
        limit = pos = iter.getIndex(&iter, UITER_CURRENT);
        if(pos == start) {
            state = ITER_CHECK_BWD;  // Check backward.
        } else {  // pos > start
            state = ITER_IN_FCD_SEGMENT;  // Stay in FCD segment.
        }
    } else {
        // Reached the start of the FCD segment.
        if(state == ITER_IN_FCD_SEGMENT) {
            // The input text segment is FCD, extend it backward.
        } else {
            // The input text segment needed to be normalized.
            // Switch to checking backward from it.
            if(state == IN_NORM_ITER_AT_LIMIT) {
                iter.move(&iter, start - limit, UITER_CURRENT);
            }
            limit = start;
        }
        state = ITER_CHECK_BWD;
    }
}